

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_busy_timeout(sqlite3 *db,int ms)

{
  sqlite3_mutex *psVar1;
  
  psVar1 = db->mutex;
  if (ms < 1) {
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar1);
    }
    db->busyTimeout = 0;
    (db->busyHandler).xBusyHandler = (_func_int_void_ptr_int *)0x0;
    (db->busyHandler).pBusyArg = (void *)0x0;
    *(undefined8 *)((long)&(db->busyHandler).pBusyArg + 5) = 0;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  else {
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar1);
    }
    (db->busyHandler).xBusyHandler = sqliteDefaultBusyCallback;
    (db->busyHandler).pBusyArg = db;
    (db->busyHandler).nBusy = 0;
    (db->busyHandler).bExtraFileArg = '\0';
    db->busyTimeout = 0;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    db->busyTimeout = ms;
    (db->busyHandler).bExtraFileArg = '\x01';
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_busy_timeout(sqlite3 *db, int ms){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  if( ms>0 ){
    sqlite3_busy_handler(db, (int(*)(void*,int))sqliteDefaultBusyCallback,
                             (void*)db);
    db->busyTimeout = ms;
    db->busyHandler.bExtraFileArg = 1;
  }else{
    sqlite3_busy_handler(db, 0, 0);
  }
  return SQLITE_OK;
}